

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O1

bool __thiscall
DNSResolve::ParseResponse
          (DNSResolve *this,char *recv_data,string *hostname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ip_result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cname_result)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  bool bVar4;
  size_t sVar5;
  char *encoded_str;
  uint uVar6;
  uint16_t encoded_name_len;
  in_addr addr;
  char ip_str [16];
  char dot_name [128];
  uint16_t local_108;
  ushort local_106;
  undefined4 local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  char *local_e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d0;
  char local_c8 [16];
  char local_b8 [136];
  
  local_b8[0x70] = '\0';
  local_b8[0x71] = '\0';
  local_b8[0x72] = '\0';
  local_b8[0x73] = '\0';
  local_b8[0x74] = '\0';
  local_b8[0x75] = '\0';
  local_b8[0x76] = '\0';
  local_b8[0x77] = '\0';
  local_b8[0x78] = '\0';
  local_b8[0x79] = '\0';
  local_b8[0x7a] = '\0';
  local_b8[0x7b] = '\0';
  local_b8[0x7c] = '\0';
  local_b8[0x7d] = '\0';
  local_b8[0x7e] = '\0';
  local_b8[0x7f] = '\0';
  local_b8[0x60] = '\0';
  local_b8[0x61] = '\0';
  local_b8[0x62] = '\0';
  local_b8[99] = '\0';
  local_b8[100] = '\0';
  local_b8[0x65] = '\0';
  local_b8[0x66] = '\0';
  local_b8[0x67] = '\0';
  local_b8[0x68] = '\0';
  local_b8[0x69] = '\0';
  local_b8[0x6a] = '\0';
  local_b8[0x6b] = '\0';
  local_b8[0x6c] = '\0';
  local_b8[0x6d] = '\0';
  local_b8[0x6e] = '\0';
  local_b8[0x6f] = '\0';
  local_b8[0x50] = '\0';
  local_b8[0x51] = '\0';
  local_b8[0x52] = '\0';
  local_b8[0x53] = '\0';
  local_b8[0x54] = '\0';
  local_b8[0x55] = '\0';
  local_b8[0x56] = '\0';
  local_b8[0x57] = '\0';
  local_b8[0x58] = '\0';
  local_b8[0x59] = '\0';
  local_b8[0x5a] = '\0';
  local_b8[0x5b] = '\0';
  local_b8[0x5c] = '\0';
  local_b8[0x5d] = '\0';
  local_b8[0x5e] = '\0';
  local_b8[0x5f] = '\0';
  local_b8[0x40] = '\0';
  local_b8[0x41] = '\0';
  local_b8[0x42] = '\0';
  local_b8[0x43] = '\0';
  local_b8[0x44] = '\0';
  local_b8[0x45] = '\0';
  local_b8[0x46] = '\0';
  local_b8[0x47] = '\0';
  local_b8[0x48] = '\0';
  local_b8[0x49] = '\0';
  local_b8[0x4a] = '\0';
  local_b8[0x4b] = '\0';
  local_b8[0x4c] = '\0';
  local_b8[0x4d] = '\0';
  local_b8[0x4e] = '\0';
  local_b8[0x4f] = '\0';
  local_b8[0x30] = '\0';
  local_b8[0x31] = '\0';
  local_b8[0x32] = '\0';
  local_b8[0x33] = '\0';
  local_b8[0x34] = '\0';
  local_b8[0x35] = '\0';
  local_b8[0x36] = '\0';
  local_b8[0x37] = '\0';
  local_b8[0x38] = '\0';
  local_b8[0x39] = '\0';
  local_b8[0x3a] = '\0';
  local_b8[0x3b] = '\0';
  local_b8[0x3c] = '\0';
  local_b8[0x3d] = '\0';
  local_b8[0x3e] = '\0';
  local_b8[0x3f] = '\0';
  local_b8[0x20] = '\0';
  local_b8[0x21] = '\0';
  local_b8[0x22] = '\0';
  local_b8[0x23] = '\0';
  local_b8[0x24] = '\0';
  local_b8[0x25] = '\0';
  local_b8[0x26] = '\0';
  local_b8[0x27] = '\0';
  local_b8[0x28] = '\0';
  local_b8[0x29] = '\0';
  local_b8[0x2a] = '\0';
  local_b8[0x2b] = '\0';
  local_b8[0x2c] = '\0';
  local_b8[0x2d] = '\0';
  local_b8[0x2e] = '\0';
  local_b8[0x2f] = '\0';
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0x1e] = '\0';
  local_b8[0x1f] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  local_108 = 0;
  if (((*(ushort *)(recv_data + 2) & 0x7ffb) == 0x81) &&
     (local_106 = *(ushort *)(recv_data + 6), local_106 != 0)) {
    uVar1 = *(ushort *)(recv_data + 4);
    encoded_str = recv_data + 0xc;
    local_e0 = recv_data;
    local_d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cname_result;
    local_d0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ip_result;
    if (uVar1 != 0) {
      uVar6 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
      do {
        bVar4 = DecodeDotStr(this,encoded_str,&local_108,local_b8,0x80,(char *)0x0);
        if (!bVar4) {
          return false;
        }
        if ((hostname->_M_string_length == 0) && (local_b8[0] != '\0')) {
          strlen(local_b8);
          std::__cxx11::string::_M_replace((ulong)hostname,0,(char *)0x0,(ulong)local_b8);
        }
        encoded_str = encoded_str +
                      (ulong)this->kDnsTypeSize + (ulong)local_108 + (ulong)this->kDnsClassSzie;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    uVar6 = (uint)(ushort)(local_106 << 8 | local_106 >> 8);
    do {
      bVar4 = DecodeDotStr(this,encoded_str,&local_108,local_b8,0x80,local_e0);
      if (!bVar4) {
        return false;
      }
      uVar1 = *(ushort *)(encoded_str + local_108);
      lVar3 = (ulong)this->kDnsClassSzie + (ulong)this->kDnsTypeSize + (ulong)local_108;
      uVar2 = *(ushort *)(encoded_str + (ulong)this->kDnsTtlSize + lVar3);
      encoded_str = encoded_str + (ulong)this->kDnsDatalenSize + (ulong)this->kDnsTtlSize + lVar3;
      if (uVar1 == 0x100) {
        local_104 = *(undefined4 *)encoded_str;
        inet_ntop(2,&local_104,local_c8,0x10);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        sVar5 = strlen(local_c8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,local_c8,local_c8 + sVar5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_d0,&local_100);
LAB_00111cec:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p);
        }
LAB_00111d66:
        encoded_str = encoded_str + (ushort)(uVar2 << 8 | uVar2 >> 8);
        bVar4 = true;
      }
      else {
        if ((ushort)(uVar1 << 8 | uVar1 >> 8) != this->kDnsTypeCname) goto LAB_00111d66;
        bVar4 = DecodeDotStr(this,encoded_str,&local_108,local_b8,0x80,local_e0);
        if (bVar4) {
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          sVar5 = strlen(local_b8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100,local_b8,local_b8 + sVar5);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_d8,&local_100);
          goto LAB_00111cec;
        }
        bVar4 = false;
      }
      if (!bVar4) {
        return false;
      }
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return true;
}

Assistant:

bool DNSResolve::ParseResponse(
    char* recv_data,
    string& hostname,
    vector<string>& ip_result,
    vector<string>& cname_result)
{
    char dot_name[128] = { '\0' };
    uint16_t encoded_name_len = 0;

    DNSHeader *dns_header = (DNSHeader*)recv_data;
    uint16_t question_count = 0;
    uint16_t answer_count = 0;

    if ((ntohs(dns_header->flags) & 0xfb7f) == 0x8100 //RFC1035 4.1.1(Header section format)
            && (question_count = ntohs(dns_header->question_count)) >= 0
            && (answer_count = ntohs(dns_header->answer_count)) > 0)
    {
        char *dns_data = recv_data + sizeof(DNSHeader);

        //resolve Question fields
        for (int question_index = 0; question_index != question_count; ++question_index)
        {
            if (!DecodeDotStr(dns_data, &encoded_name_len, dot_name, sizeof(dot_name)))
            {
                return false;
            }
            if (hostname.empty() && strlen(dot_name) > 0)
            {
                hostname = dot_name;
            }
            dns_data += (encoded_name_len + kDnsTypeSize + kDnsClassSzie);
        }

        //resolve Answer fields
        for (int answer_index = 0; answer_index != answer_count; ++answer_index)
        {
            if (!DecodeDotStr(dns_data, &encoded_name_len, dot_name, sizeof(dot_name), recv_data))
            {
                return false;
            }
            dns_data += encoded_name_len;

            uint16_t answer_type = ntohs(*(uint16_t*)(dns_data));
            uint16_t answer_class = ntohs(*(uint16_t*)(dns_data + kDnsTypeSize));
            uint32_t answer_ttl = ntohl(*(uint32_t*)(dns_data + kDnsTypeSize + kDnsClassSzie));
            uint16_t answer_data_len = ntohs(*(uint16_t*)(dns_data + kDnsTypeSize + kDnsClassSzie + kDnsTtlSize));
            dns_data += (kDnsTypeSize + kDnsClassSzie + kDnsTtlSize + kDnsDatalenSize);

            if (answer_type == kDnsTypeA)
            {
                in_addr addr;
                addr.s_addr = *(u_long*)dns_data;
                char ip_str[16];
                inet_ntop(AF_INET, &addr, ip_str, 16);
                ip_result.push_back(ip_str);
            }
            else if (answer_type == kDnsTypeCname)
            {
                if (!DecodeDotStr(dns_data, &encoded_name_len, dot_name, sizeof(dot_name), recv_data))
                {
                    return false;
                }
                cname_result.push_back(dot_name);
            }
            dns_data += (answer_data_len);
        }
    }
    return true;
}